

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::PtexUtils::reduceTri
               (void *src,int sstride,int w,int param_4,void *dst,int dstride,DataType dt,int nchan)

{
  int unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000020;
  
  switch(in_stack_00000008) {
  case 0:
    anon_unknown_1::reduceTri<unsigned_char>
              ((uchar *)CONCAT44(param_4,in_stack_00000020),dst._4_4_,(int)dst,dstride,
               (uchar *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,(int)src);
    break;
  case 1:
    anon_unknown_1::reduceTri<unsigned_short>
              ((unsigned_short *)CONCAT44(param_4,in_stack_00000020),dst._4_4_,(int)dst,dstride,
               (unsigned_short *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
               (int)src);
    break;
  case 2:
    anon_unknown_1::reduceTri<Ptex::v2_2::PtexHalf>
              ((PtexHalf *)src,sstride,w,param_4,(PtexHalf *)dst,dstride,dt);
    break;
  case 3:
    anon_unknown_1::reduceTri<float>
              ((float *)CONCAT44(param_4,in_stack_00000020),dst._4_4_,(int)dst,dstride,
               (float *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,(int)src);
  }
  return;
}

Assistant:

void reduceTri(const void* src, int sstride, int w, int /*vw*/,
               void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduceTri(static_cast<const uint8_t*>(src), sstride, w, 0,
                                 static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduceTri(static_cast<const PtexHalf*>(src), sstride, w, 0,
                                 static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduceTri(static_cast<const uint16_t*>(src), sstride, w, 0,
                                 static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduceTri(static_cast<const float*>(src), sstride, w, 0,
                                 static_cast<float*>(dst), dstride, nchan); break;
    }
}